

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

void xmlCheckVersion(int version)

{
  undefined8 uVar1;
  ulong uVar2;
  char *fmt;
  
  xmlInitParser();
  if (version - 20000U < 10000) {
    if ((uint)version < 0x53fc) {
      return;
    }
    uVar2 = (ulong)(ushort)((ushort)version / 100);
    fmt = "Warning: program compiled against libxml %d using older %d\n";
    uVar1 = 0xd6;
  }
  else {
    fmt = "Fatal: program compiled against libxml %d using libxml %d\n";
    uVar1 = 2;
    uVar2 = (long)version / 10000 & 0xffffffff;
  }
  xmlPrintErrorMessage(fmt,uVar2,uVar1);
  return;
}

Assistant:

void
xmlCheckVersion(int version) {
    int myversion = LIBXML_VERSION;

    xmlInitParser();

    if ((myversion / 10000) != (version / 10000)) {
	xmlPrintErrorMessage(
		"Fatal: program compiled against libxml %d using libxml %d\n",
		(version / 10000), (myversion / 10000));
    } else if ((myversion / 100) < (version / 100)) {
	xmlPrintErrorMessage(
		"Warning: program compiled against libxml %d using older %d\n",
		(version / 100), (myversion / 100));
    }
}